

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::readHeadOfDataObject(XFileParser *this,string *poName)

{
  Scene *this_00;
  bool bVar1;
  string nameOrBrace;
  allocator local_61;
  string local_60;
  string local_40;
  
  GetNextToken_abi_cxx11_(&local_40,this);
  bVar1 = std::operator!=(&local_40,"{");
  if (bVar1) {
    if (poName != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)poName);
    }
    GetNextToken_abi_cxx11_(&local_60,this);
    bVar1 = std::operator!=(&local_60,"{");
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar1) {
      this_00 = this->mScene;
      if (this_00 != (Scene *)0x0) {
        XFile::Scene::~Scene(this_00);
      }
      operator_delete(this_00);
      std::__cxx11::string::string((string *)&local_60,"Opening brace expected.",&local_61);
      ThrowException(this,&local_60);
    }
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void XFileParser::readHeadOfDataObject( std::string* poName)
{
    std::string nameOrBrace = GetNextToken();
    if( nameOrBrace != "{")
    {
        if( poName)
            *poName = nameOrBrace;

        if ( GetNextToken() != "{" ) {
            delete mScene;
            ThrowException( "Opening brace expected." );
        }
    }
}